

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexFilters.cpp
# Opt level: O0

void __thiscall
Ptex::v2_2::PtexPointFilterTri::eval
          (PtexPointFilterTri *this,float *result,int firstchan,int nchannels,int faceid,float u,
          float v,float param_8,float param_9,float param_10,float param_11,float param_12,
          float param_13)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Res *this_00;
  int in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float vf;
  float uf;
  int vi;
  int ui;
  float vt;
  float ut;
  int resm1;
  int res;
  FaceInfo *f;
  int in_stack_ffffffffffffff7c;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  
  if ((((*(long *)(in_RDI + 8) != 0) && (0 < in_ECX)) && (-1 < in_R8D)) &&
     (iVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x60))(), in_R8D < iVar1)) {
    this_00 = (Res *)(**(code **)(**(long **)(in_RDI + 8) + 0x80))(*(long **)(in_RDI + 8),in_R8D);
    iVar1 = Res::u(this_00);
    iVar2 = PtexUtils::clamp<int>
                      (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
    iVar3 = PtexUtils::clamp<int>
                      (in_stack_ffffffffffffff84,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c
                      );
    if (1.0 < (in_XMM0_Da * (float)iVar1 - (float)iVar2) +
              (in_XMM1_Da * (float)iVar1 - (float)iVar3)) {
      (**(code **)(**(long **)(in_RDI + 8) + 0xa8))
                (*(long **)(in_RDI + 8),in_R8D,(iVar1 + -1) - iVar3,(iVar1 + -1) - iVar2,in_RSI,
                 in_EDX,in_ECX);
    }
    else {
      (**(code **)(**(long **)(in_RDI + 8) + 0xa8))
                (*(long **)(in_RDI + 8),in_R8D,iVar2,iVar3,in_RSI,in_EDX,in_ECX);
    }
  }
  return;
}

Assistant:

virtual void eval(float* result, int firstchan, int nchannels,
                      int faceid, float u, float v,
                      float /*uw1*/, float /*vw1*/, float /*uw2*/, float /*vw2*/,
                      float /*width*/, float /*blur*/)
    {
        if (!_tx || nchannels <= 0) return;
        if (faceid < 0 || faceid >= _tx->numFaces()) return;
        const FaceInfo& f = _tx->getFaceInfo(faceid);
        int res = f.res.u();
        int resm1 = res - 1;
        float ut = u * (float)res, vt = v * (float)res;
        int ui = PtexUtils::clamp(int(ut), 0, resm1);
        int vi = PtexUtils::clamp(int(vt), 0, resm1);
        float uf = ut - (float)ui, vf = vt - (float)vi;

        if (uf + vf <= 1.0f) {
            // "even" triangles are stored in lower-left half-texture
            _tx->getPixel(faceid, ui, vi, result, firstchan, nchannels);
        }
        else {
            // "odd" triangles are stored in upper-right half-texture
            _tx->getPixel(faceid, resm1-vi, resm1-ui, result, firstchan, nchannels);
        }
    }